

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateInterface
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *descriptor;
  Context *context;
  java *this_00;
  ImmutableFieldLiteGenerator *pIVar1;
  OneofGeneratorInfo *pOVar2;
  ClassNameResolver *this_01;
  _Base_ptr p_Var3;
  Descriptor *descriptor_00;
  int i;
  long lVar4;
  long lVar5;
  char *local_58;
  string local_50;
  
  descriptor = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string((string *)&local_50,"OrBuilder",(allocator *)&local_58);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,descriptor,true,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = (java *)(this->super_MessageGenerator).descriptor_;
  if (*(int *)(this_00 + 0x78) < 1) {
    local_58 = "@java.lang.Deprecated ";
    if (*(char *)(*(long *)(this_00 + 0x20) + 0x4a) == '\0') {
      local_58 = "";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_(&local_50,this_00,descriptor_00);
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1]>
              (printer,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageLiteOrBuilder {\n"
               ,(char (*) [12])0x40d447,&local_58,(char (*) [17])"extra_interfaces",&local_50,
               (char (*) [10])0x3dd2a7,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((this->super_MessageGenerator).descriptor_ + 8),(char (*) [2])0x428b8c,
               (char (*) [1])0x3cb5b9,(char (*) [2])0x4143ea,(char (*) [1])0x3cb5b9);
  }
  else {
    local_58 = "@java.lang.Deprecated ";
    if (*(char *)(*(long *)(this_00 + 0x20) + 0x4a) == '\0') {
      local_58 = "";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_(&local_50,this_00,descriptor_00);
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1]>
              (printer,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends \n    $extra_interfaces$\n     com.google.protobuf.GeneratedMessageLite.\n          ExtendableMessageOrBuilder<\n              $classname$, $classname$.Builder> {\n"
               ,(char (*) [12])0x40d447,&local_58,(char (*) [17])"extra_interfaces",&local_50,
               (char (*) [10])0x3dd2a7,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((this->super_MessageGenerator).descriptor_ + 8),(char (*) [2])0x428b8c,
               (char (*) [1])0x3cb5b9,(char (*) [2])0x4143ea,(char (*) [1])0x3cb5b9);
  }
  std::__cxx11::string::~string((string *)&local_50);
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,"{","}",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)((this->super_MessageGenerator).descriptor_ + 4);
      lVar4 = lVar4 + 1) {
    io::Printer::Print<>(printer,"\n");
    pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar5));
    (*pIVar1->_vptr_ImmutableFieldLiteGenerator[3])(pIVar1,printer);
    lVar5 = lVar5 + 0x48;
  }
  for (p_Var3 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pOVar2 = Context::GetOneofGeneratorInfo(this->context_,*(OneofDescriptor **)(p_Var3 + 1));
    this_01 = Context::GetNameResolver(this->context_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_50,this_01,(this->super_MessageGenerator).descriptor_);
    io::Printer::Print<char[23],std::__cxx11::string,char[10],std::__cxx11::string>
              (printer,
               "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
               ,(char (*) [23])"oneof_capitalized_name",&pOVar2->capitalized_name,
               (char (*) [10])0x3dd2a7,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends \n"
        "    $extra_interfaces$\n"
        "     com.google.protobuf.GeneratedMessageLite.\n"
        "          ExtendableMessageOrBuilder<\n"
        "              $classname$, $classname$.Builder> {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  } else {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageLiteOrBuilder {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  }
  printer->Annotate("{", "}", descriptor_);

  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateInterfaceMembers(printer);
  }
  for (auto oneof : oneofs_) {
    printer->Print(
        "\n"
        "public $classname$.$oneof_capitalized_name$Case "
        "get$oneof_capitalized_name$Case();\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name, "classname",
        context_->GetNameResolver()->GetImmutableClassName(descriptor_));
  }
  printer->Outdent();

  printer->Print("}\n");
}